

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DarknetUtility.cpp
# Opt level: O0

void __thiscall
DarknetUtility::DarknetUtility
          (DarknetUtility *this,string *configPath,string *weightsPath,string *labelsPath)

{
  string *labelsPath_local;
  string *weightsPath_local;
  string *configPath_local;
  DarknetUtility *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->weightsFilePath);
  std::__cxx11::string::string((string *)&this->labelsFilePath);
  std::vector<cv::Scalar_<double>,_std::allocator<cv::Scalar_<double>_>_>::vector(&this->colors);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->classes);
  cv::dnn::dnn4_v20211004::Net::Net(&this->net);
  std::__cxx11::string::operator=((string *)this,(string *)configPath);
  std::__cxx11::string::operator=((string *)&this->weightsFilePath,(string *)weightsPath);
  std::__cxx11::string::operator=((string *)&this->labelsFilePath,(string *)labelsPath);
  loadNetWork(this);
  loadClasses(this);
  generateRandomColors(this);
  return;
}

Assistant:

DarknetUtility::DarknetUtility(std::string configPath, std::string weightsPath, std::string labelsPath)
{
    this->configFilePath = configPath;
    this->weightsFilePath = weightsPath;
    this->labelsFilePath = labelsPath;
    loadNetWork();
    loadClasses();
    generateRandomColors();
}